

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O0

Node * __thiscall
Lexical::errorParsing
          (Node *__return_storage_ptr__,Lexical *this,int *returnIndex,int errIndex,int errCode)

{
  int errCode_local;
  int errIndex_local;
  int *returnIndex_local;
  Lexical *this_local;
  
  Generator::recovery(&this->generator);
  this->wordIndex = *returnIndex;
  if ((errIndex != -1) && (this->lastErrorIndex <= errIndex)) {
    this->lastErrorIndex = errIndex;
    this->lastErrorCode = errCode;
  }
  Node::Node(__return_storage_ptr__,&nullNode);
  return __return_storage_ptr__;
}

Assistant:

Node errorParsing(const int &returnIndex, const int errIndex=-1, const int errCode=-1) {
		generator.recovery();
		wordIndex = returnIndex;
		if (errIndex != -1) {
			if (lastErrorIndex <= errIndex) {
				lastErrorIndex = errIndex;
				lastErrorCode = errCode;
			}
		}
		return nullNode;
	}